

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.hpp
# Opt level: O2

shared_ptr<duckdb::EncryptionState,_true> __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLSFactory::CreateEncryptionState
          (AESStateMBEDTLSFactory *this,string *key)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::EncryptionState,_true> sVar2;
  EncryptionUtil local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [3];
  
  duckdb::
  make_shared_ptr<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS,std::__cxx11::string_const*&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_28);
  _Var1._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_EncryptionUtil)._vptr_EncryptionUtil = local_28._vptr_EncryptionUtil;
  this[1].super_EncryptionUtil._vptr_EncryptionUtil = (_func_int **)_Var1._M_pi;
  local_28._vptr_EncryptionUtil = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  sVar2.internal.super___shared_ptr<duckdb::EncryptionState,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::EncryptionState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::EncryptionState,_true>)
         sVar2.internal.super___shared_ptr<duckdb::EncryptionState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

duckdb::shared_ptr<duckdb::EncryptionState> CreateEncryptionState(const std::string *key = nullptr) const override {
			return duckdb::make_shared_ptr<MbedTlsWrapper::AESStateMBEDTLS>(key);
		}